

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsSS.cpp
# Opt level: O2

void __thiscall helics::tcp::TcpCommsSS::queue_tx_function(TcpCommsSS *this)

{
  uint uVar1;
  io_context *piVar2;
  TcpConnection *pTVar3;
  pointer ppVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  mapped_type *pmVar10;
  iterator iVar11;
  char *__rhs;
  iterator iVar12;
  mapped_type *__args_1;
  _Base_ptr p_Var13;
  element_type *in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  ActionMessage *command;
  void *__buf_04;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>
  *mc;
  pointer ppVar14;
  element_type *peVar15;
  element_type *peVar16;
  string *in_R8;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  pointer conn;
  route_id rid;
  undefined1 local_500 [40];
  pointer server;
  pointer brokerConnection;
  undefined1 local_4b0 [40];
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  made_connections;
  allocator<char> local_458 [32];
  pointer new_connect;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [11];
  undefined1 local_378 [24];
  allocator<char> local_360 [16];
  LoopHandle contextLoop;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  undefined1 local_318 [8];
  undefined1 auStack_310 [24];
  undefined1 auStack_2f8 [32];
  undefined1 auStack_2d8 [64];
  element_type *peStack_298;
  undefined1 local_290 [56];
  string cstring;
  vector<char,_std::allocator<char>_> buffer;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  established_routes;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  undefined1 local_1c8 [24];
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  undefined1 local_188 [24];
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  undefined1 local_148 [16];
  code *local_138;
  code *local_130;
  ActionMessage cmessage;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
     ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0)) {
    iVar9 = getDefaultPort(0xb);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar9;
    UNLOCK();
  }
  if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == false) &&
     (this->outgoingConnectionsAllowed == false)) {
    message_01._M_str = "no server and no outgoing connections-> no way to connect to comms";
    message_01._M_len = 0x42;
    CommsInterface::logError((CommsInterface *)this,message_01);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    return;
  }
  server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_428;
  new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_428[0]._M_local_buf[0] = '\0';
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&ioctx,(string *)&new_connect);
  std::__cxx11::string::~string((string *)&new_connect);
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)local_378,&this->encryption_config,true);
  }
  else {
    local_378._0_8_ = (element_type *)0x0;
    local_378._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_378._16_8_ = (void *)0x0;
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&contextLoop);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    in_RCX = (element_type *)
             &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    uVar1 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i;
    in_R8 = (string *)(ulong)(uVar1 & 0xffff);
    gmlc::networking::TcpServer::create
              ((TcpServer *)&new_connect,(SocketFactory *)local_378,
               ((ioctx.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,(string *)in_RCX,
               (uint16_t)uVar1,true,
               (this->super_NetworkCommsInterface).super_CommsInterface.maxMessageSize);
    std::__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2> *)&new_connect
              );
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &new_connect.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    do {
      if ((((server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->halted)._M_base._M_i & 1U) == 0) {
        local_50._8_8_ = 0;
        local_38 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                   ::_M_manager;
        local_50._M_unused._M_object = this;
        std::
        function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
        ::operator=(&(server.
                      super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->dataCall,
                    (function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                     *)&local_50);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_50);
        local_70._8_8_ = 0;
        local_58 = std::
                   _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                   ::_M_invoke;
        local_60 = std::
                   _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                   ::_M_manager;
        local_70._M_unused._M_object = this;
        std::
        function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
        operator=(&(server.
                    super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->errorCall,
                  (function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                   *)&local_70);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_70);
        gmlc::networking::TcpServer::start
                  (server.
                   super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        goto LAB_0025c06b;
      }
      message._M_str = "retrying tcp bind";
      message._M_len = 0x11;
      CommsInterface::logWarning((CommsInterface *)this,message);
      new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x96;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&new_connect);
      bVar7 = gmlc::networking::TcpServer::reConnect
                        (server.
                         super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(milliseconds)
                                 (this->super_NetworkCommsInterface).super_CommsInterface.
                                 connectionTimeout.__r);
    } while (bVar7);
    iVar9 = 0x27;
    message_00._M_str = "unable to bind to tcp connection socket";
    message_00._M_len = 0x27;
    CommsInterface::logError((CommsInterface *)this,message_00);
    gmlc::networking::TcpServer::close
              (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,iVar9);
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    goto LAB_0025d3b1;
  }
LAB_0025c06b:
  ActionMessage::ActionMessage(&cmessage,cmd_protocol);
  cmessage.messageID = 299;
  NetworkCommsInterface::getAddress_abi_cxx11_
            ((string *)&new_connect,&this->super_NetworkCommsInterface);
  SmallBuffer::operator=
            (&cmessage.payload,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&new_connect);
  std::__cxx11::string::~string((string *)&new_connect);
  ActionMessage::packetize_abi_cxx11_(&cstring,&cmessage);
  made_connections.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  established_routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &established_routes._M_t._M_impl.super__Rb_tree_header._M_header;
  established_routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  established_routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  established_routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  made_connections.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  made_connections.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  established_routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       established_routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->outgoingConnectionsAllowed == true) {
    peVar15 = (element_type *)
              (this->connections).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (peVar16 = (element_type *)
                   (this->connections).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; peVar16 != peVar15;
        peVar16 = (element_type *)
                  &(peVar16->socket_).
                   super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount) {
      in_R8 = (string *)0x0;
      in_RCX = peVar16;
      gmlc::networking::establishConnection
                ((networking *)&new_connect,(SocketFactory *)local_378,
                 ((ioctx.
                   super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->ictx)._M_t.
                 super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
                 super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,(string *)peVar16,
                 (milliseconds)0x0);
      if (new_connect.
          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        local_188._8_8_ = 0;
        local_170 = std::
                    _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                    ::_M_invoke;
        local_188._16_8_ =
             std::
             _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
             ::_M_manager;
        local_188._0_8_ = this;
        gmlc::networking::TcpConnection::setDataCall
                  (new_connect.
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                           *)local_188);
        CLI::std::_Function_base::~_Function_base((_Function_base *)local_188);
        local_1a8._8_8_ = 0;
        local_190 = std::
                    _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                    ::_M_invoke;
        local_198 = std::
                    _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                    ::_M_manager;
        local_1a8._M_unused._M_object = this;
        gmlc::networking::TcpConnection::setErrorCall
                  (new_connect.
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                           *)&local_1a8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
        gmlc::networking::TcpConnection::send
                  (new_connect.
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(int)&cstring,__buf,(size_t)in_RCX,(int)in_R8);
        gmlc::networking::TcpConnection::startReceive
                  (new_connect.
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::
        vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
        ::emplace_back<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::TcpConnection>>
                  ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                    *)&made_connections,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar16,
                   (shared_ptr<gmlc::networking::TcpConnection> *)&new_connect);
      }
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &new_connect.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &routes._M_t._M_impl.super__Rb_tree_header._M_header;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  routes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  brokerConnection.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  brokerConnection.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_4b0._32_8_ = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
  routes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
LAB_0025c567:
    CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    do {
      rid.rid = -0x4d3263e0;
      local_318 = (undefined1  [8])0x0;
      auStack_310._0_8_ =
           (__uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>)
           0x9aac0f0000000000;
      auStack_310._8_8_ =
           (__uniq_ptr_impl<asio::io_context::work,_std::default_delete<asio::io_context::work>_>)
           0x9aac0f0000000000;
      auStack_2d8._56_8_ = (__pthread_internal_list *)0x0;
      peStack_298 = (element_type *)0x0;
      auStack_2d8._40_8_ = 0;
      auStack_2d8._48_8_ = (__pthread_internal_list *)0x0;
      auStack_2d8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      auStack_2d8._32_8_ = 0;
      auStack_2d8._8_8_ = 0;
      auStack_2d8._16_8_ = (element_type *)0x0;
      auStack_2f8._24_8_ = (__pthread_internal_list *)0x0;
      auStack_2d8._0_8_ = 0;
      auStack_2f8._8_8_ = 0;
      auStack_2f8._16_8_ = 0;
      auStack_310[0x10] = false;
      auStack_310._17_3_ = 0;
      auStack_310._20_4_ = stopped;
      auStack_2f8._0_8_ = 0;
      local_290._0_8_ = 0x40;
      local_290._8_8_ = auStack_2d8;
      local_290._32_8_ = (__pthread_internal_list *)0x0;
      local_290._40_8_ = (__pthread_internal_list *)0x0;
      local_290._16_8_ = 0;
      local_290._24_8_ = (__pthread_internal_list *)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)&new_connect,
            &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue);
      conn.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&rid;
      peVar15 = (element_type *)&new_connect;
      conn.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_318;
      std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                ((tuple<helics::route_id&,helics::ActionMessage&> *)&conn,
                 (pair<helics::route_id,_helics::ActionMessage> *)&new_connect);
      ActionMessage::~ActionMessage
                ((ActionMessage *)
                 &new_connect.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ppVar4 = made_connections.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      peVar16 = brokerConnection.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if ((((local_318._0_4_ == -60000) || (local_318._0_4_ == 0x1000ea60)) ||
          (local_318._0_4_ == 60000)) && (rid.rid == -1)) {
        if (local_318._4_4_ == 0xe9) {
          bVar7 = false;
          for (ppVar14 = made_connections.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar4;
              ppVar14 = ppVar14 + 1) {
            if ((ppVar14->second).
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              in_RCX = (element_type *)(ppVar14->first)._M_dataplus._M_p;
              __y._M_str = (char *)in_RCX;
              __y._M_len = (ppVar14->first)._M_string_length;
              __x._M_str = (char *)local_290._8_8_;
              __x._M_len = (size_t)peStack_298;
              bVar8 = std::operator==(__x,__y);
              if (bVar8) {
                new_connect.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         CONCAT44(new_connect.
                                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._4_4_,auStack_310._12_4_);
                std::
                _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                          ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                            *)&routes,(route_id *)&new_connect,&ppVar14->second);
                uVar5 = auStack_310._12_4_;
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                          ::operator[](&established_routes,&ppVar14->first);
                pmVar10->rid = uVar5;
                bVar7 = true;
              }
            }
          }
          if (!bVar7) {
            conn.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = peStack_298;
            conn.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_;
            in_RCX = (element_type *)local_290._8_8_;
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)&new_connect,
                       (basic_string_view<char,_std::char_traits<char>_> *)&conn,
                       (allocator<char> *)local_500);
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                     ::find(&established_routes._M_t,(key_type *)&new_connect);
            std::__cxx11::string::~string((string *)&new_connect);
            if ((_Rb_tree_header *)iVar12._M_node ==
                &established_routes._M_t._M_impl.super__Rb_tree_header) {
              if (this->outgoingConnectionsAllowed != true) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&conn,"outgoing connections not allowed ",local_458);
                local_4b0._0_8_ = peStack_298;
                local_4b0._8_8_ = local_290._8_8_;
                in_RCX = (element_type *)local_290._8_8_;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)local_500,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_4b0,local_360);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &new_connect,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &conn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_500);
                message_06._M_str =
                     (char *)new_connect.
                             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                message_06._M_len =
                     (size_t)new_connect.
                             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                CommsInterface::logWarning((CommsInterface *)this,message_06);
                goto LAB_0025c819;
              }
              piVar2 = ((ioctx.
                         super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->ictx)._M_t.
                       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                       .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
              local_500._0_8_ = peStack_298;
              local_500._8_8_ = local_290._8_8_;
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&new_connect,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_500,
                         (allocator<char> *)local_4b0);
              in_R8 = (string *)0x0;
              in_RCX = (element_type *)&new_connect;
              gmlc::networking::establishConnection
                        ((networking *)&conn,(SocketFactory *)local_378,piVar2,
                         (string *)&new_connect,(milliseconds)0x0);
              std::__cxx11::string::~string((string *)&new_connect);
              if (conn.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr != (element_type *)0x0) {
                local_1c8._8_8_ = 0;
                local_1b0 = std::
                            _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                            ::_M_invoke;
                local_1c8._16_8_ =
                     std::
                     _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                     ::_M_manager;
                local_1c8._0_8_ = this;
                gmlc::networking::TcpConnection::setDataCall
                          (conn.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                                    *)local_1c8);
                CLI::std::_Function_base::~_Function_base((_Function_base *)local_1c8);
                local_1e8._8_8_ = (__pthread_internal_list *)0x0;
                local_1d0 = std::
                            _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                            ::_M_invoke;
                local_1d8 = std::
                            _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                            ::_M_manager;
                local_1e8._M_unused._M_object = this;
                gmlc::networking::TcpConnection::setErrorCall
                          (conn.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                                    *)&local_1e8);
                CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
                gmlc::networking::TcpConnection::send
                          (conn.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(int)&cstring,__buf_04,(size_t)in_RCX,(int)in_R8);
                gmlc::networking::TcpConnection::startReceive
                          (conn.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
                new_connect.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)
                         CONCAT44(new_connect.
                                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr._4_4_,auStack_310._12_4_);
                std::
                _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                ::
                _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                          ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                            *)&routes,(route_id *)&new_connect,&conn);
                uVar5 = auStack_310._12_4_;
                local_500._0_8_ = peStack_298;
                local_500._8_8_ = local_290._8_8_;
                in_RCX = peStack_298;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&new_connect,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_500,
                           (allocator<char> *)local_4b0);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                          ::operator[](&established_routes,(key_type *)&new_connect);
                pmVar10->rid = uVar5;
                std::__cxx11::string::~string((string *)&new_connect);
              }
              goto LAB_0025cc4c;
            }
            if (iVar12._M_node[2]._M_color == _S_red) {
              new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT44(new_connect.
                              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,auStack_310._12_4_);
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)&routes,(route_id *)&new_connect,&brokerConnection);
            }
            else {
              new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)
                     CONCAT44(new_connect.
                              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._4_4_,auStack_310._12_4_);
              __args_1 = std::
                         map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                         ::operator[](&routes,(key_type *)(iVar12._M_node + 2));
              std::
              _Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              _M_emplace_unique<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>&>
                        ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>,std::_Select1st<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)&routes,(route_id *)&new_connect,__args_1);
            }
          }
        }
        else if (local_318._4_4_ == 0xf4) {
          new_connect.
          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(new_connect.
                        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._4_4_,auStack_310._12_4_);
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ::erase(&routes._M_t,(key_type *)&new_connect);
        }
        else if (local_318._4_4_ == 299) {
          if (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            gmlc::networking::TcpServer::findSocket
                      ((TcpServer *)&conn,
                       (int)server.
                            super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
            if (conn.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr == (element_type *)0x0) {
              message_05._M_str = "(tcpss) unable to locate socket";
              message_05._M_len = 0x1f;
              CommsInterface::logWarning((CommsInterface *)this,message_05);
            }
            else if (brokerConnection.
                     super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr == (element_type *)0x0) {
              in_RCX = (element_type *)
                       (this->super_NetworkCommsInterface).super_CommsInterface.brokerName.
                       _M_dataplus._M_p;
              __y_00._M_str = (char *)in_RCX;
              __y_00._M_len =
                   (this->super_NetworkCommsInterface).super_CommsInterface.brokerName.
                   _M_string_length;
              __x_00._M_str = (char *)local_290._8_8_;
              __x_00._M_len = (size_t)peStack_298;
              bVar7 = std::operator==(__x_00,__y_00);
              uVar6 = local_290._8_8_;
              peVar16 = peStack_298;
              if (!bVar7) {
                gmlc::networking::makePortAddress
                          ((string *)&new_connect,(string *)local_4b0._32_8_,
                           (this->super_NetworkCommsInterface).brokerPort);
                __y_01._M_str =
                     (char *)new_connect.
                             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                __y_01._M_len =
                     (size_t)new_connect.
                             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                __x_01._M_str = (char *)uVar6;
                __x_01._M_len = (size_t)peVar16;
                in_RCX = new_connect.
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                bVar7 = std::operator==(__x_01,__y_01);
                std::__cxx11::string::~string((string *)&new_connect);
                if (!bVar7) {
                  if (conn.
                      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr == (element_type *)0x0) goto LAB_0025cc4c;
                  goto LAB_0025c8a2;
                }
              }
              std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::
              operator=(&brokerConnection.
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                        ,&conn.
                          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                       );
            }
            else {
LAB_0025c8a2:
              new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = peStack_298;
              new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._8_8_;
              in_RCX = (element_type *)local_290._8_8_;
              std::
              vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
              ::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<gmlc::networking::TcpConnection>>
                        ((vector<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                          *)&made_connections,
                         (basic_string_view<char,_std::char_traits<char>_> *)&new_connect,&conn);
            }
LAB_0025cc4c:
            CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &conn.
                        super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
        else if (local_318._4_4_ == 0x16570bf) {
          CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
        }
        else {
          if (local_318._4_4_ == 0x9db) goto LAB_0025d202;
          message_02._M_str = "unrecognized control command";
          message_02._M_len = 0x1c;
          CommsInterface::logWarning((CommsInterface *)this,message_02);
        }
      }
      else {
        iVar9 = (int)(element_type *)&new_connect;
        peVar15 = (element_type *)&new_connect;
        if (rid.rid == 0) {
          if ((((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) ||
             (brokerConnection.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&conn,"(tcpss) no route to broker for message, message dropped :",
                       (allocator<char> *)local_500);
            __rhs = actionMessageType(cmd_ignore);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &new_connect,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conn,__rhs);
            message_03._M_str =
                 (char *)new_connect.
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
            message_03._M_len =
                 (size_t)new_connect.
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            CommsInterface::logWarning((CommsInterface *)this,message_03);
            peVar16 = (element_type *)&new_connect;
LAB_0025c826:
            std::__cxx11::string::~string((string *)peVar16);
            peVar15 = (element_type *)&conn;
          }
          else {
            ActionMessage::packetize_abi_cxx11_((string *)&new_connect,(ActionMessage *)local_318);
            gmlc::networking::TcpConnection::send(peVar16,iVar9,__buf_02,(size_t)in_RCX,(int)in_R8);
          }
        }
        else {
          iVar11 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   ::find(&routes._M_t,&rid);
          peVar16 = brokerConnection.
                    super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          in_RCX = (element_type *)&routes._M_t._M_impl.super__Rb_tree_header;
          if ((element_type *)iVar11._M_node == in_RCX) {
            if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
              bVar7 = isDisconnectCommand((ActionMessage *)local_318);
              if (bVar7) goto LAB_0025c835;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&conn,"(tcpss) unknown message destination message dropped ",
                         (allocator<char> *)local_4b0);
              prettyPrintString_abi_cxx11_((string *)local_500,(helics *)local_318,command);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &new_connect,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &conn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_500);
              message_04._M_str =
                   (char *)new_connect.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
              message_04._M_len =
                   (size_t)new_connect.
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
              CommsInterface::logWarning((CommsInterface *)this,message_04);
LAB_0025c819:
              std::__cxx11::string::~string((string *)&new_connect);
              peVar16 = (element_type *)local_500;
              goto LAB_0025c826;
            }
            ActionMessage::packetize_abi_cxx11_((string *)&new_connect,(ActionMessage *)local_318);
            gmlc::networking::TcpConnection::send(peVar16,iVar9,__buf_03,(size_t)in_RCX,(int)in_R8);
          }
          else {
            pTVar3 = (TcpConnection *)iVar11._M_node[1]._M_parent;
            ActionMessage::packetize_abi_cxx11_((string *)&new_connect,(ActionMessage *)local_318);
            gmlc::networking::TcpConnection::send(pTVar3,iVar9,__buf_01,(size_t)in_RCX,(int)in_R8);
          }
        }
        std::__cxx11::string::~string((string *)peVar15);
      }
LAB_0025c835:
      ActionMessage::~ActionMessage((ActionMessage *)local_318);
    } while( true );
  }
  iVar9 = (this->super_NetworkCommsInterface).brokerPort;
  if (iVar9 < 0) {
    iVar9 = getDefaultPort(0xb);
    (this->super_NetworkCommsInterface).brokerPort = iVar9;
  }
  if (this->outgoingConnectionsAllowed != true) goto LAB_0025c567;
  piVar2 = ((ioctx.
             super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->ictx)._M_t.
           super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
           super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
           super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl;
  CLI::std::__cxx11::to_string((string *)&new_connect,iVar9);
  in_R8 = (string *)&new_connect;
  in_RCX = (element_type *)local_4b0._32_8_;
  gmlc::networking::establishConnection
            ((networking *)local_318,(SocketFactory *)local_378,piVar2,(string *)local_4b0._32_8_,
             in_R8,(milliseconds)
                   (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
  std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&brokerConnection.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)local_318)
  ;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_310);
  std::__cxx11::string::~string((string *)&new_connect);
  if (brokerConnection.
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_148._8_8_ = 0;
    local_130 = std::
                _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                ::_M_invoke;
    local_138 = std::
                _Function_handler<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:159:9)>
                ::_M_manager;
    local_148._0_8_ = this;
    gmlc::networking::TcpConnection::setDataCall
              (brokerConnection.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
                       *)local_148);
    CLI::std::_Function_base::~_Function_base((_Function_base *)local_148);
    local_168._8_8_ = 0;
    local_150 = std::
                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpCommsSS.cpp:163:22)>
                ::_M_manager;
    local_168._M_unused._M_object = this;
    gmlc::networking::TcpConnection::setErrorCall
              (brokerConnection.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
                       *)&local_168);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_168);
    gmlc::networking::TcpConnection::send
              (brokerConnection.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int)&cstring,__buf_00,(size_t)in_RCX,(int)in_R8);
    gmlc::networking::TcpConnection::startReceive
              (brokerConnection.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    gmlc::networking::makePortAddress
              ((string *)&new_connect,(string *)local_4b0._32_8_,
               (this->super_NetworkCommsInterface).brokerPort);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
              ::operator[](&established_routes,(key_type *)&new_connect);
    pmVar10->rid = 0;
    std::__cxx11::string::~string((string *)&new_connect);
    goto LAB_0025c567;
  }
  iVar9 = 0x26;
  message_07._M_str = "initial connection to broker timed out";
  message_07._M_len = 0x26;
  CommsInterface::logError((CommsInterface *)this,message_07);
  if (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    gmlc::networking::TcpServer::close
              (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,iVar9);
  }
  CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
  CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
LAB_0025d359:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~_Rb_tree(&routes._M_t);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &brokerConnection.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::~_Rb_tree(&established_routes._M_t);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~vector(&made_connections);
  std::__cxx11::string::~string((string *)&cstring);
  ActionMessage::~ActionMessage(&cmessage);
LAB_0025d3b1:
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr(&contextLoop);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8));
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ioctx.
              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
LAB_0025d202:
  ActionMessage::~ActionMessage((ActionMessage *)local_318);
  ppVar4 = made_connections.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar14 = made_connections.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar14 != ppVar4; ppVar14 = ppVar14 + 1
      ) {
    pTVar3 = (ppVar14->second).
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pTVar3 != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close(pTVar3,(int)peVar15);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear(&made_connections);
  for (p_Var13 = routes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &routes._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
    if ((TcpConnection *)p_Var13[1]._M_parent != (TcpConnection *)0x0) {
      gmlc::networking::TcpConnection::close((TcpConnection *)p_Var13[1]._M_parent,(int)peVar15);
    }
  }
  if (brokerConnection.
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    gmlc::networking::TcpConnection::close
              (brokerConnection.
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int)peVar15);
  }
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear(&routes._M_t);
  new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&brokerConnection.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
             &new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &new_connect.
              super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  iVar9 = 2;
  CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
  if (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x32;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&new_connect);
    gmlc::networking::TcpServer::close
              (server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,iVar9);
    new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    new_connect.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&server.super___shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<gmlc::networking::TcpServer,_(__gnu_cxx::_Lock_policy)2> *)&new_connect
              );
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &new_connect.
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
  }
  goto LAB_0025d359;
}

Assistant:

void TcpCommsSS::queue_tx_function()
{
    if (serverMode && (PortNumber < 0)) {
        PortNumber = getDefaultBrokerPort();
    }
    if (!serverMode && !outgoingConnectionsAllowed) {
        logError("no server and no outgoing connections-> no way to connect to comms");
        setRxStatus(ConnectionStatus::ERRORED);
        setTxStatus(ConnectionStatus::ERRORED);
        return;
    }
    gmlc::networking::TcpServer::pointer server;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    auto dataCall =
        [this](const TcpConnection::pointer& connection, const char* data, size_t datasize) {
            return dataReceive(connection.get(), data, datasize);
        };
    CommsInterface* ci = this;
    auto errorCall = [ci](const TcpConnection::pointer& connection, const std::error_code& error) {
        return commErrorHandler(ci, connection.get(), error);
    };

    if (serverMode) {
        server = gmlc::networking::TcpServer::create(sf,
                                                     ioctx->getBaseContext(),
                                                     localTargetAddress,
                                                     static_cast<uint16_t>(PortNumber.load()),
                                                     true,
                                                     maxMessageSize);
        while (!server->isReady()) {
            logWarning("retrying tcp bind");
            std::this_thread::sleep_for(std::chrono::milliseconds(150));
            auto connected = server->reConnect(connectionTimeout);
            if (!connected) {
                logError("unable to bind to tcp connection socket");
                server->close();
                setRxStatus(ConnectionStatus::ERRORED);
                setTxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
        server->setDataCall(dataCall);
        server->setErrorCall(errorCall);
        server->start();
    }

    // generate a local protocol connection string
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.payload = getAddress();
    auto cstring = cmessage.packetize();

    std::vector<std::pair<std::string, TcpConnection::pointer>> made_connections;
    std::map<std::string, route_id> established_routes;
    if (outgoingConnectionsAllowed) {
        for (const auto& conn : connections) {
            try {
                auto new_connect =
                    gmlc::networking::establishConnection(sf, ioctx->getBaseContext(), conn);

                if (new_connect) {
                    new_connect->setDataCall(dataCall);
                    new_connect->setErrorCall(errorCall);
                    new_connect->send(cstring);
                    new_connect->startReceive();

                    made_connections.emplace_back(conn, std::move(new_connect));
                }
            }
            catch (const std::exception& e) {
                logWarning(std::string("unable to establish connection with ") + conn +
                           "::" + e.what());
            }
        }
    }
    setRxStatus(ConnectionStatus::CONNECTED);
    std::vector<char> buffer;

    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (brokerPort < 0) {
            brokerPort = getDefaultBrokerPort();
        }
        if (outgoingConnectionsAllowed) {
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         std::chrono::milliseconds(
                                                                             connectionTimeout));
                if (!brokerConnection) {
                    logError("initial connection to broker timed out");

                    if (server) {
                        server->close();
                    }
                    setTxStatus(ConnectionStatus::ERRORED);
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }

                brokerConnection->setDataCall(dataCall);
                brokerConnection->setErrorCall(errorCall);

                brokerConnection->send(cstring);
                brokerConnection->startReceive();
            }
            catch (std::exception& e) {
                logError(std::string("unable to establish connection with ") + brokerTargetAddress +
                         "::" + e.what());
                setTxStatus(ConnectionStatus::ERRORED);
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
            established_routes[gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort)] =
                parent_route_id;
        }
    }

    setTxStatus(ConnectionStatus::CONNECTED);

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                processed = true;
                switch (cmd.messageID) {
                    case CONNECTION_INFORMATION:
                        if (server) {
                            auto conn = server->findSocket(cmd.getExtraData());
                            if (conn) {
                                if (!brokerConnection) {  // check if the connection matches the
                                                          // broker
                                    if ((cmd.payload.to_string() == brokerName) ||
                                        (cmd.payload.to_string() ==
                                         gmlc::networking::makePortAddress(brokerTargetAddress,
                                                                           brokerPort))) {
                                        brokerConnection = std::move(conn);
                                        break;
                                    }
                                }
                                if (conn) {
                                    made_connections.emplace_back(cmd.payload.to_string(),
                                                                  std::move(conn));
                                }
                            } else {
                                logWarning("(tcpss) unable to locate socket");
                            }
                        }
                        break;
                    case NEW_ROUTE: {
                        bool established = false;

                        for (auto& mc : made_connections) {
                            if ((mc.second) && (cmd.payload.to_string() == mc.first)) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(mc.second));
                                established = true;
                                established_routes[mc.first] = route_id{cmd.getExtraData()};
                            }
                        }
                        if (!established) {
                            auto efind =
                                established_routes.find(std::string(cmd.payload.to_string()));
                            if (efind != established_routes.end()) {
                                established = true;
                                if (efind->second == parent_route_id) {
                                    routes.emplace(route_id{cmd.getExtraData()}, brokerConnection);
                                } else {
                                    routes.emplace(route_id{cmd.getExtraData()},
                                                   routes[efind->second]);
                                }
                            }
                        }

                        if (!established) {
                            if (outgoingConnectionsAllowed) {
                                try {
                                    auto new_connect = gmlc::networking::establishConnection(
                                        sf,
                                        ioctx->getBaseContext(),
                                        std::string(cmd.payload.to_string()));
                                    if (new_connect) {
                                        new_connect->setDataCall(dataCall);
                                        new_connect->setErrorCall(errorCall);
                                        new_connect->send(cstring);
                                        new_connect->startReceive();
                                        routes.emplace(route_id{cmd.getExtraData()},
                                                       std::move(new_connect));
                                        established_routes[std::string(cmd.payload.to_string())] =
                                            route_id{cmd.getExtraData()};
                                    }
                                }
                                catch (const std::exception& e) {
                                    logWarning(std::string("unable to establish connection with ") +
                                               std::string(cmd.payload.to_string()) +
                                               "::" + e.what());
                                }
                            } else {
                                logWarning(std::string("outgoing connections not allowed ") +
                                           std::string(cmd.payload.to_string()));
                            }
                        }
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        setRxStatus(ConnectionStatus::TERMINATED);
                        break;
                    case DISCONNECT:
                        haltLoop = true;
                        continue;
                    default:
                        logWarning("unrecognized control command");
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if ((hasBroker) && (brokerConnection)) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }
            } else {
                logWarning(
                    std::string("(tcpss) no route to broker for message, message dropped :") +
                    actionMessageType(cmd.action()));
            }
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send ") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcpss) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }  // while (!haltLoop)

    for (auto& rt : made_connections) {
        if (rt.second) {
            rt.second->close();
        }
    }
    made_connections.clear();
    for (auto& rt : routes) {
        if (rt.second) {
            rt.second->close();
        }
    }
    if (brokerConnection) {
        brokerConnection->close();
    }
    routes.clear();
    brokerConnection = nullptr;
    setTxStatus(ConnectionStatus::TERMINATED);
    if (server) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        server->close();
        server = nullptr;
    }
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}